

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O2

uint32_t MurmurHashAligned2(void *key,int len,uint32_t seed)

{
  uint *puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar6 = seed ^ len;
  uVar8 = (uint)key;
  uVar10 = uVar8 & 3;
  if (len < 4 || ((ulong)key & 3) == 0) {
    for (; 3 < len; len = len + -4) {
      iVar3 = *key;
      key = (void *)((long)key + 4);
      uVar6 = uVar6 * 0x5bd1e995 ^
              ((uint)(iVar3 * 0x5bd1e995) >> 0x18 ^ iVar3 * 0x5bd1e995) * 0x5bd1e995;
    }
    if (len != 1) {
      if (len != 2) {
        if (len != 3) goto LAB_0015e1bf;
        uVar6 = uVar6 ^ (uint)*(byte *)((long)key + 2) << 0x10;
      }
      uVar6 = uVar6 ^ (uint)*(byte *)((long)key + 1) << 8;
    }
    bVar2 = *key;
  }
  else {
    uVar4 = 0;
    uVar11 = 0;
    if (uVar10 != 3) {
      if (uVar10 != 2) {
        uVar11 = (uint)*(byte *)((long)key + 2) << 0x10;
      }
      uVar4 = uVar11 | (uint)*(byte *)((long)key + 1) << 8;
    }
    iVar3 = uVar10 * 8;
    pbVar5 = (byte *)((ulong)(4 - uVar10) + 1 + (long)key);
    uVar9 = (4 - uVar10) * 8;
    uVar11 = (*key | uVar4) << iVar3;
    for (iVar7 = len + -4; 3 < (uVar8 & 3) + iVar7; iVar7 = iVar7 + -4) {
      puVar1 = (uint *)(pbVar5 + -1);
      pbVar5 = pbVar5 + 4;
      uVar11 = (*puVar1 << (uVar9 & 0x1f) | uVar11 >> iVar3) * 0x5bd1e995;
      uVar6 = uVar6 * 0x5bd1e995 ^ (uVar11 >> 0x18 ^ uVar11) * 0x5bd1e995;
      uVar11 = *puVar1;
    }
    uVar4 = (uVar8 & 3) + iVar7;
    if ((int)uVar4 < (int)uVar10) {
      if (uVar4 == 2) {
        uVar8 = (uint)*pbVar5 << 8;
LAB_0015e1a3:
        uVar4 = pbVar5[-1] | uVar8;
      }
      else {
        uVar8 = 0;
        if (uVar4 == 1) goto LAB_0015e1a3;
      }
      uVar6 = ((uVar4 << (uVar9 & 0x1f) | uVar11 >> iVar3) ^ uVar6) * 0x5bd1e995;
      goto LAB_0015e1bf;
    }
    uVar4 = 0;
    if (uVar10 != 1) {
      if (uVar10 != 2) {
        uVar4 = (uint)pbVar5[1] << 0x10;
      }
      uVar4 = uVar4 | (uint)*pbVar5 << 8;
    }
    uVar10 = ((pbVar5[-1] | uVar4) << (uVar9 & 0x1f) | uVar11 >> iVar3) * 0x5bd1e995;
    uVar6 = uVar6 * 0x5bd1e995 ^ (uVar10 >> 0x18 ^ uVar10) * 0x5bd1e995;
    if (iVar7 != 1) {
      if (iVar7 != 2) goto LAB_0015e1bf;
      uVar6 = uVar6 ^ (uint)pbVar5[uVar8 & 3] << 8;
    }
    bVar2 = pbVar5[(ulong)(uVar8 & 3) - 1];
  }
  uVar6 = (bVar2 ^ uVar6) * 0x5bd1e995;
LAB_0015e1bf:
  uVar6 = (uVar6 >> 0xd ^ uVar6) * 0x5bd1e995;
  return uVar6 >> 0xf ^ uVar6;
}

Assistant:

uint32_t MurmurHashAligned2 ( const void * key, int len, uint32_t seed )
{
  const uint32_t m = 0x5bd1e995;
  const int r = 24;

  const unsigned char * data = (const unsigned char *)key;

  uint32_t h = seed ^ len;

  int align = (uint64_t)data & 3;

  if(align && (len >= 4))
  {
    // Pre-load the temp registers

    uint32_t t = 0, d = 0;

    switch(align)
    {
      case 1: t |= data[2] << 16;
      case 2: t |= data[1] << 8;
      case 3: t |= data[0];
    }

    t <<= (8 * align);

    data += 4-align;
    len -= 4-align;

    int sl = 8 * (4-align);
    int sr = 8 * align;

    // Mix

    while(len >= 4)
    {
      d = *(uint32_t *)data;
      t = (t >> sr) | (d << sl);

      uint32_t k = t;

      MIX(h,k,m);

      t = d;

      data += 4;
      len -= 4;
    }

    // Handle leftover data in temp registers

    d = 0;

    if(len >= align)
    {
      switch(align)
      {
      case 3: d |= data[2] << 16;
      case 2: d |= data[1] << 8;
      case 1: d |= data[0];
      }

      uint32_t k = (t >> sr) | (d << sl);
      MIX(h,k,m);

      data += align;
      len -= align;

      //----------
      // Handle tail bytes

      switch(len)
      {
      case 3: h ^= data[2] << 16;
      case 2: h ^= data[1] << 8;
      case 1: h ^= data[0];
          h *= m;
      };
    }
    else
    {
      switch(len)
      {
      case 3: d |= data[2] << 16;
      case 2: d |= data[1] << 8;
      case 1: d |= data[0];
      case 0: h ^= (t >> sr) | (d << sl);
          h *= m;
      }
    }

    h ^= h >> 13;
    h *= m;
    h ^= h >> 15;

    return h;
  }
  else
  {
    while(len >= 4)
    {
      uint32_t k = *(uint32_t *)data;

      MIX(h,k,m);

      data += 4;
      len -= 4;
    }

    //----------
    // Handle tail bytes

    switch(len)
    {
    case 3: h ^= data[2] << 16;
    case 2: h ^= data[1] << 8;
    case 1: h ^= data[0];
        h *= m;
    };

    h ^= h >> 13;
    h *= m;
    h ^= h >> 15;

    return h;
  }
}